

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O2

void inv_taylor<taylor<taylor<double,1,2>,1,2>,2>
               (taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *t,
               taylor<taylor<double,_1,_2>,_1,_2> *a)

{
  double dVar1;
  taylor<taylor<double,_1,_2>,_1,_2> *ptVar2;
  taylor<taylor<double,_1,_2>,_1,_2> *ptVar3;
  long lVar4;
  int iVar5;
  taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *ptVar6;
  int i;
  int i_00;
  bool bVar7;
  byte bVar8;
  taylor<taylor<double,_1,_2>,_1,_2> local_c0;
  taylor<taylor<double,_1,_2>,_1,_2> local_78;
  
  bVar8 = 0;
  dVar1 = (a->super_polynomial<taylor<double,_1,_2>,_1,_2>).c[0].super_polynomial<double,_1,_2>.c[0]
  ;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    __assert_fail("a != 0 && \"1/(a+x) not analytic at a = 0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uekstrom[P]libtaylor/taylor_math.hpp"
                  ,0x24,
                  "void inv_taylor(taylor<T, 1, N> &, const T &) [T = taylor<taylor<double, 1, 2>, 1, 2>, N = 2]"
                 );
  }
  local_c0.super_polynomial<taylor<double,_1,_2>,_1,_2>.c[0].super_polynomial<double,_1,_2>.c[0].
  _0_4_ = 1;
  operator/(&local_78,(int *)&local_c0,a);
  ptVar2 = &local_78;
  ptVar6 = t;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    (ptVar6->super_polynomial<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>).c[0].
    super_polynomial<taylor<double,_1,_2>,_1,_2>.c[0].super_polynomial<double,_1,_2>.c[0] =
         (ptVar2->super_polynomial<taylor<double,_1,_2>,_1,_2>).c[0].super_polynomial<double,_1,_2>.
         c[0];
    ptVar2 = (taylor<taylor<double,_1,_2>,_1,_2> *)((long)ptVar2 + ((ulong)bVar8 * -2 + 1) * 8);
    ptVar6 = (taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2> *)
             ((long)ptVar6 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  i_00 = 1;
  iVar5 = 2;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    ptVar2 = taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator[](t,i_00 + -1);
    taylor<taylor<double,_1,_2>,_1,_2>::operator-(&local_c0,ptVar2);
    operator*(&local_78,&local_c0,(taylor<taylor<double,_1,_2>,_1,_2> *)t);
    ptVar3 = taylor<taylor<taylor<double,_1,_2>,_1,_2>,_1,_2>::operator[](t,i_00);
    ptVar2 = &local_78;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      (ptVar3->super_polynomial<taylor<double,_1,_2>,_1,_2>).c[0].super_polynomial<double,_1,_2>.c
      [0] = (ptVar2->super_polynomial<taylor<double,_1,_2>,_1,_2>).c[0].
            super_polynomial<double,_1,_2>.c[0];
      ptVar2 = (taylor<taylor<double,_1,_2>,_1,_2> *)((long)ptVar2 + ((ulong)bVar8 * -2 + 1) * 8);
      ptVar3 = (taylor<taylor<double,_1,_2>,_1,_2> *)((long)ptVar3 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    i_00 = i_00 + 1;
  }
  return;
}

Assistant:

inline T cbrt(T x) { return pow(x, 1.0 / 3.0); }